

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O2

stack_item * stack_peek_n(stack *stack,size_t index)

{
  stack_item *psVar1;
  stack_item *psVar2;
  long lVar3;
  
  if ((stack->head == (stack_item *)0x0) || (stack->length < index)) {
    psVar2 = (stack_item *)0x0;
  }
  else {
    lVar3 = index + 1;
    psVar1 = stack->head;
    do {
      psVar2 = psVar1;
      lVar3 = lVar3 + -1;
      if (lVar3 == 0) {
        return psVar2;
      }
      psVar1 = psVar2->next;
    } while (psVar2->next != (stack_item *)0x0);
  }
  return psVar2;
}

Assistant:

const struct stack_item *stack_peek_n(const struct stack *stack, size_t index)
{
        if (!stack_has_item(stack) || stack->length < index) {
                return NULL;
        }

        struct stack_item *curr = stack->head;
        size_t i = 0;

        while (i < index && curr != NULL && curr->next != NULL) {
                curr = curr->next;

                ++i;
        }

        return curr;
}